

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

SourceTextModuleRecord * Js::SourceTextModuleRecord::Create(ScriptContext *scriptContext)

{
  int iVar1;
  Recycler *alloc;
  SourceTextModuleRecord *this;
  ModuleRecordList *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  SourceTextModuleRecord *childModuleRecord;
  
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_586c2f7;
  data.filename._0_4_ = 0x35;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_50);
  this = (SourceTextModuleRecord *)new<Memory::Recycler>(0x120,alloc,0x391482);
  SourceTextModuleRecord(this,scriptContext);
  data._32_8_ = this;
  this_00 = JavascriptLibrary::EnsureModuleRecordList
                      ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  iVar1 = JsUtil::
          List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this_00,(SourceTextModuleRecord **)&data.line);
  *(int *)(data._32_8_ + 0xf8) = iVar1;
  return (SourceTextModuleRecord *)data._32_8_;
}

Assistant:

SourceTextModuleRecord* SourceTextModuleRecord::Create(ScriptContext* scriptContext)
    {
        Recycler* recycler = scriptContext->GetRecycler();
        SourceTextModuleRecord* childModuleRecord;
        childModuleRecord = RecyclerNewFinalized(recycler, Js::SourceTextModuleRecord, scriptContext);
        // There is no real reference to lifetime management in ecmascript
        // The life time of a module record should be controlled by the module registry as defined in WHATWG module loader spec
        // in practice the modulerecord lifetime should be the same as the scriptcontext so it could be retrieved for the same
        // site. Host might hold a reference to the module as well after initializing the module.
        // In our implementation, we'll use the moduleId in bytecode to identify the module.
        childModuleRecord->moduleId = scriptContext->GetLibrary()->EnsureModuleRecordList()->Add(childModuleRecord);

        return childModuleRecord;
    }